

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell::
~TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell
          (TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_testFailureWithDifferentFileAndLine_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithDifferentFileAndLine)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test failed", "importantFile", 999)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"importantFile:999: Test failed\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}